

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::routeMessage(CoreBroker *this,ActionMessage *cmd,GlobalFederateId dest)

{
  bool bVar1;
  route_id rVar2;
  GlobalBrokerId in_EDX;
  CoreBroker *in_RSI;
  long *in_RDI;
  route_id route;
  GlobalFederateId fedid;
  long *plVar3;
  atomic<helics::GlobalBrokerId> local_4;
  
  plVar3 = in_RDI;
  local_4._M_i.gid = (GlobalBrokerId)(GlobalBrokerId)in_EDX.gid;
  bVar1 = GlobalFederateId::isValid((GlobalFederateId *)&local_4);
  fedid.gid = (BaseType)plVar3;
  if (bVar1) {
    (in_RSI->super_BrokerBase).global_id._M_i.gid = (BaseType)local_4._M_i.gid;
    bVar1 = GlobalFederateId::operator==((GlobalFederateId *)&local_4,(GlobalBrokerId)0x0);
    if ((bVar1) ||
       (bVar1 = GlobalFederateId::operator==
                          ((GlobalFederateId *)&local_4,(GlobalBrokerId)(BaseType)in_RDI[3]), bVar1)
       ) {
      (**(code **)(*in_RDI + 0x118))(in_RDI,0,in_RSI);
    }
    else {
      rVar2 = getRoute(in_RSI,fedid);
      (**(code **)(*in_RDI + 0x118))(in_RDI,rVar2.rid,in_RSI);
    }
  }
  return;
}

Assistant:

void CoreBroker::routeMessage(ActionMessage&& cmd, GlobalFederateId dest)
{
    if (!dest.isValid()) {
        return;
    }
    cmd.dest_id = dest;
    if ((dest == parent_broker_id) || (dest == higher_broker_id)) {
        transmit(parent_route_id, std::move(cmd));
    } else {
        auto route = getRoute(dest);
        transmit(route, std::move(cmd));
    }
}